

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

bool flatbuffers::IsVectorOfTable(Type *type)

{
  if (((type->base_type == BASE_TYPE_VECTOR64) || (type->base_type == BASE_TYPE_VECTOR)) &&
     (type->element == BASE_TYPE_STRUCT)) {
    return (bool)(type->struct_def->fixed ^ 1);
  }
  return false;
}

Assistant:

inline bool IsVector(const Type &type) { return IsVector(type.base_type); }